

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.c
# Opt level: O3

void draw_replay_info(nh_replay_info *rinfo)

{
  attr_t attrs;
  int iVar1;
  size_t sVar2;
  int iVar3;
  char buf [256];
  char acStack_118 [264];
  
  sprintf(acStack_118,"REPLAY action %d/%d",(ulong)(uint)rinfo->actions,
          (ulong)(uint)rinfo->max_actions);
  if (rinfo->nextcmd[0] != '\0') {
    sVar2 = strlen(acStack_118);
    sprintf(acStack_118 + sVar2,"; next command: %s.",rinfo);
  }
  if (ui_flags.draw_frame == '\0') {
    iVar1 = (ui_flags.msgheight - (uint)(ui_flags.status3 == '\0')) + 0x18;
    if (iVar1 < _LINES) {
      wattr_on(basewin,0x200400,0);
      iVar1 = wmove(basewin,iVar1,0);
      if (iVar1 != -1) {
        waddnstr(basewin,acStack_118,0xffffffff);
      }
      wattr_off(basewin,0x200400,0);
      wclrtoeol(basewin);
    }
  }
  else {
    attrs = frame_hp_color();
    nh_box_mvwhline((WINDOW_conflict *)basewin,ui_flags.msgheight + L'\x17',L'\x01',L'P',attrs);
    wattr_on(basewin,0x200400,0);
    iVar1 = wmove(basewin,ui_flags.msgheight + 0x17,2);
    if (iVar1 != -1) {
      waddnstr(basewin,acStack_118,0xffffffff);
    }
    wattr_off(basewin,0x200400,0);
  }
  wnoutrefresh(basewin);
  iVar3 = -1;
  iVar1 = -1;
  if (msgwin != (WINDOW *)0x0) {
    iVar1 = msgwin->_maxy + 1;
  }
  wtouchln(msgwin,0,iVar1,1);
  wnoutrefresh(msgwin);
  if (mapwin != (WINDOW *)0x0) {
    iVar3 = mapwin->_maxy + 1;
  }
  wtouchln(mapwin,0,iVar3,1);
  wnoutrefresh(mapwin);
  return;
}

Assistant:

static void draw_replay_info(struct nh_replay_info *rinfo)
{
    char buf[BUFSZ];
    
    sprintf(buf, "REPLAY action %d/%d", rinfo->actions, rinfo->max_actions);
    if (*rinfo->nextcmd)
	sprintf(buf + strlen(buf), "; next command: %s.", rinfo->nextcmd);
    
    if (ui_flags.draw_frame) {
	/* draw the replay state on top of the frame under the map */
	attr_t frame_attr = frame_hp_color();
	nh_box_mvwhline(basewin, 2 + ui_flags.msgheight + ROWNO, 1, COLNO, frame_attr);

	wattron(basewin, COLOR_PAIR(4) | A_BOLD);
	mvwaddstr(basewin, 2 + ui_flags.msgheight + ROWNO, 2, buf);
	wattroff(basewin, COLOR_PAIR(4) | A_BOLD);
    } else {
	/* try to draw under the status */
	int h = ui_flags.msgheight + ROWNO + (ui_flags.status3 ? 3 : 2);
	if (h < LINES) {
	    wattron(basewin, COLOR_PAIR(4) | A_BOLD);
	    mvwaddstr(basewin, h, 0, buf);
	    wattroff(basewin, COLOR_PAIR(4) | A_BOLD);
	    wclrtoeol(basewin);
	} /* else: make do without replay info */
    }
    wnoutrefresh(basewin);
    /* refresh on basewin erases the windows on top of it ... */
    touchwin(msgwin);
    wnoutrefresh(msgwin);
    touchwin(mapwin);
    wnoutrefresh(mapwin);
}